

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *
deqp::gles31::Functional::anon_unknown_0::varyingCompatVtxOutputs
          (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
           *__return_storage_ptr__,VaryingInterface *varyings)

{
  Interpolation IVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_28;
  size_t i;
  VaryingInterface *varyings_local;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *outputs;
  
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::vector
            (__return_storage_ptr__,&varyings->vtxOutputs);
  for (local_28 = 0;
      sVar2 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                        (__return_storage_ptr__), local_28 < sVar2; local_28 = local_28 + 1) {
    pvVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&varyings->frgInputs,local_28);
    IVar1 = pvVar3->interpolation;
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](__return_storage_ptr__,local_28);
    pvVar4->interpolation = IVar1;
    pvVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&varyings->frgInputs,local_28);
    pvVar4 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](__return_storage_ptr__,local_28);
    std::__cxx11::string::operator=((string *)&pvVar4->name,(string *)&pvVar3->name);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VariableDeclaration> varyingCompatVtxOutputs (const VaryingInterface& varyings)
{
	vector<VariableDeclaration> outputs = varyings.vtxOutputs;

	for (size_t i = 0; i < outputs.size(); ++i)
	{
		outputs[i].interpolation = varyings.frgInputs[i].interpolation;
		outputs[i].name = varyings.frgInputs[i].name;
	}

	return outputs;
}